

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IpxWrapper.cpp
# Opt level: O0

bool illegalIpxSolvedStatus(Info *ipx_info,HighsOptions *options)

{
  HighsOptions *in_RSI;
  long in_RDI;
  bool found_illegal_status;
  undefined8 in_stack_fffffffffffffce8;
  int value;
  undefined5 in_stack_fffffffffffffcf0;
  undefined1 in_stack_fffffffffffffcf5;
  byte bVar1;
  undefined1 in_stack_fffffffffffffcf6;
  undefined1 in_stack_fffffffffffffcf7;
  HighsOptions *in_stack_fffffffffffffcf8;
  undefined8 in_stack_fffffffffffffd00;
  allocator *paVar2;
  undefined1 status_error;
  bool local_2f3;
  bool local_2db;
  bool local_2c3;
  bool local_2ab;
  bool local_293;
  bool local_27b;
  bool local_263;
  bool local_24b;
  bool local_233;
  bool local_21b;
  allocator local_201;
  string local_200 [37];
  byte local_1db;
  byte local_1da;
  allocator local_1d9;
  string local_1d8 [37];
  byte local_1b3;
  byte local_1b2;
  allocator local_1b1;
  string local_1b0 [37];
  byte local_18b;
  byte local_18a;
  allocator local_189;
  string local_188 [37];
  byte local_163;
  byte local_162;
  allocator local_161;
  string local_160 [37];
  byte local_13b;
  byte local_13a;
  allocator local_139;
  string local_138 [37];
  byte local_113;
  byte local_112;
  allocator local_111;
  string local_110 [37];
  byte local_eb;
  byte local_ea;
  allocator local_e9;
  string local_e8 [37];
  byte local_c3;
  byte local_c2;
  allocator local_c1;
  string local_c0 [37];
  byte local_9b;
  byte local_9a;
  allocator local_99;
  string local_98 [37];
  byte local_73;
  byte local_72;
  allocator local_71;
  string local_70 [35];
  byte local_4d;
  byte local_3a;
  allocator local_39;
  string local_38 [39];
  bool local_11;
  HighsOptions *local_10;
  long local_8;
  
  status_error = (undefined1)((ulong)in_stack_fffffffffffffd00 >> 0x38);
  local_11 = false;
  local_3a = 0;
  local_4d = 0;
  value = (int)((ulong)in_stack_fffffffffffffce8 >> 0x20);
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::allocator<char>::allocator();
  local_3a = 1;
  std::__cxx11::string::string
            (local_38,"solved  status_ipm should not be IPX_STATUS_time_limit",&local_39);
  local_4d = 1;
  local_11 = ipxStatusError((bool)status_error,in_stack_fffffffffffffcf8,
                            (string *)
                            CONCAT17(in_stack_fffffffffffffcf7,
                                     CONCAT16(in_stack_fffffffffffffcf6,
                                              CONCAT15(in_stack_fffffffffffffcf5,
                                                       in_stack_fffffffffffffcf0))),value);
  if ((local_4d & 1) != 0) {
    std::__cxx11::string::~string(local_38);
  }
  if ((local_3a & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  local_72 = 0;
  local_73 = 0;
  local_21b = true;
  if ((local_11 & 1U) == 0) {
    std::allocator<char>::allocator();
    local_72 = 1;
    std::__cxx11::string::string
              (local_70,"solved  status_ipm should not be IPX_STATUS_iter_limit",&local_71);
    local_73 = 1;
    local_21b = ipxStatusError((bool)status_error,in_stack_fffffffffffffcf8,
                               (string *)
                               CONCAT17(in_stack_fffffffffffffcf7,
                                        CONCAT16(in_stack_fffffffffffffcf6,
                                                 CONCAT15(in_stack_fffffffffffffcf5,
                                                          in_stack_fffffffffffffcf0))),value);
  }
  local_11 = local_21b;
  if ((local_73 & 1) != 0) {
    std::__cxx11::string::~string(local_70);
  }
  if ((local_72 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
  }
  local_9a = 0;
  local_9b = 0;
  local_233 = true;
  if ((local_11 & 1U) == 0) {
    std::allocator<char>::allocator();
    local_9a = 1;
    std::__cxx11::string::string
              (local_98,"solved  status_ipm should not be IPX_STATUS_no_progress",&local_99);
    local_9b = 1;
    local_233 = ipxStatusError((bool)status_error,in_stack_fffffffffffffcf8,
                               (string *)
                               CONCAT17(in_stack_fffffffffffffcf7,
                                        CONCAT16(in_stack_fffffffffffffcf6,
                                                 CONCAT15(in_stack_fffffffffffffcf5,
                                                          in_stack_fffffffffffffcf0))),value);
  }
  local_11 = local_233;
  if ((local_9b & 1) != 0) {
    std::__cxx11::string::~string(local_98);
  }
  if ((local_9a & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
  }
  local_c2 = 0;
  local_c3 = 0;
  local_24b = true;
  if ((local_11 & 1U) == 0) {
    std::allocator<char>::allocator();
    local_c2 = 1;
    std::__cxx11::string::string
              (local_c0,"solved  status_ipm should not be IPX_STATUS_failed",&local_c1);
    local_c3 = 1;
    local_24b = ipxStatusError((bool)status_error,in_stack_fffffffffffffcf8,
                               (string *)
                               CONCAT17(in_stack_fffffffffffffcf7,
                                        CONCAT16(in_stack_fffffffffffffcf6,
                                                 CONCAT15(in_stack_fffffffffffffcf5,
                                                          in_stack_fffffffffffffcf0))),value);
  }
  local_11 = local_24b;
  if ((local_c3 & 1) != 0) {
    std::__cxx11::string::~string(local_c0);
  }
  if ((local_c2 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  }
  local_ea = 0;
  local_eb = 0;
  local_263 = true;
  if ((local_11 & 1U) == 0) {
    std::allocator<char>::allocator();
    local_ea = 1;
    std::__cxx11::string::string
              (local_e8,"solved  status_ipm should not be IPX_STATUS_debug",&local_e9);
    local_eb = 1;
    local_263 = ipxStatusError((bool)status_error,in_stack_fffffffffffffcf8,
                               (string *)
                               CONCAT17(in_stack_fffffffffffffcf7,
                                        CONCAT16(in_stack_fffffffffffffcf6,
                                                 CONCAT15(in_stack_fffffffffffffcf5,
                                                          in_stack_fffffffffffffcf0))),value);
  }
  local_11 = local_263;
  if ((local_eb & 1) != 0) {
    std::__cxx11::string::~string(local_e8);
  }
  if ((local_ea & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  }
  local_112 = 0;
  local_113 = 0;
  local_27b = true;
  if ((local_11 & 1U) == 0) {
    std::allocator<char>::allocator();
    local_112 = 1;
    std::__cxx11::string::string
              (local_110,"solved  status_crossover should not be IPX_STATUS_primal_infeas",
               &local_111);
    local_113 = 1;
    local_27b = ipxStatusError((bool)status_error,in_stack_fffffffffffffcf8,
                               (string *)
                               CONCAT17(in_stack_fffffffffffffcf7,
                                        CONCAT16(in_stack_fffffffffffffcf6,
                                                 CONCAT15(in_stack_fffffffffffffcf5,
                                                          in_stack_fffffffffffffcf0))),value);
  }
  local_11 = local_27b;
  if ((local_113 & 1) != 0) {
    std::__cxx11::string::~string(local_110);
  }
  if ((local_112 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_111);
  }
  local_13a = 0;
  local_13b = 0;
  local_293 = true;
  if ((local_11 & 1U) == 0) {
    std::allocator<char>::allocator();
    local_13a = 1;
    std::__cxx11::string::string
              (local_138,"solved  status_crossover should not be IPX_STATUS_dual_infeas",&local_139)
    ;
    local_13b = 1;
    local_293 = ipxStatusError((bool)status_error,in_stack_fffffffffffffcf8,
                               (string *)
                               CONCAT17(in_stack_fffffffffffffcf7,
                                        CONCAT16(in_stack_fffffffffffffcf6,
                                                 CONCAT15(in_stack_fffffffffffffcf5,
                                                          in_stack_fffffffffffffcf0))),value);
  }
  local_11 = local_293;
  if ((local_13b & 1) != 0) {
    std::__cxx11::string::~string(local_138);
  }
  if ((local_13a & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_139);
  }
  local_162 = 0;
  local_163 = 0;
  local_2ab = true;
  if ((local_11 & 1U) == 0) {
    std::allocator<char>::allocator();
    local_162 = 1;
    std::__cxx11::string::string
              (local_160,"solved  status_crossover should not be IPX_STATUS_time_limit",&local_161);
    local_163 = 1;
    local_2ab = ipxStatusError((bool)status_error,in_stack_fffffffffffffcf8,
                               (string *)
                               CONCAT17(in_stack_fffffffffffffcf7,
                                        CONCAT16(in_stack_fffffffffffffcf6,
                                                 CONCAT15(in_stack_fffffffffffffcf5,
                                                          in_stack_fffffffffffffcf0))),value);
  }
  local_11 = local_2ab;
  if ((local_163 & 1) != 0) {
    std::__cxx11::string::~string(local_160);
  }
  if ((local_162 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_161);
  }
  local_18a = 0;
  local_18b = 0;
  local_2c3 = true;
  if ((local_11 & 1U) == 0) {
    std::allocator<char>::allocator();
    local_18a = 1;
    std::__cxx11::string::string
              (local_188,"solved  status_crossover should not be IPX_STATUS_iter_limit",&local_189);
    local_18b = 1;
    local_2c3 = ipxStatusError((bool)status_error,in_stack_fffffffffffffcf8,
                               (string *)
                               CONCAT17(in_stack_fffffffffffffcf7,
                                        CONCAT16(in_stack_fffffffffffffcf6,
                                                 CONCAT15(in_stack_fffffffffffffcf5,
                                                          in_stack_fffffffffffffcf0))),value);
  }
  local_11 = local_2c3;
  if ((local_18b & 1) != 0) {
    std::__cxx11::string::~string(local_188);
  }
  if ((local_18a & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_189);
  }
  local_1b2 = 0;
  local_1b3 = 0;
  local_2db = true;
  if ((local_11 & 1U) == 0) {
    std::allocator<char>::allocator();
    local_1b2 = 1;
    std::__cxx11::string::string
              (local_1b0,"solved  status_crossover should not be IPX_STATUS_no_progress",&local_1b1)
    ;
    local_1b3 = 1;
    local_2db = ipxStatusError((bool)status_error,in_stack_fffffffffffffcf8,
                               (string *)
                               CONCAT17(in_stack_fffffffffffffcf7,
                                        CONCAT16(in_stack_fffffffffffffcf6,
                                                 CONCAT15(in_stack_fffffffffffffcf5,
                                                          in_stack_fffffffffffffcf0))),value);
  }
  local_11 = local_2db;
  if ((local_1b3 & 1) != 0) {
    std::__cxx11::string::~string(local_1b0);
  }
  if ((local_1b2 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
  }
  local_1da = 0;
  local_1db = 0;
  local_2f3 = true;
  if ((local_11 & 1U) == 0) {
    in_stack_fffffffffffffcf7 = *(int *)(local_8 + 8) == 9;
    paVar2 = &local_1d9;
    std::allocator<char>::allocator();
    local_1da = 1;
    std::__cxx11::string::string
              (local_1d8,"solved  status_crossover should not be IPX_STATUS_failed",paVar2);
    local_1db = 1;
    status_error = (undefined1)((ulong)paVar2 >> 0x38);
    in_stack_fffffffffffffcf6 =
         ipxStatusError((bool)status_error,local_10,
                        (string *)
                        CONCAT17(in_stack_fffffffffffffcf7,
                                 CONCAT16(in_stack_fffffffffffffcf6,
                                          CONCAT15(in_stack_fffffffffffffcf5,
                                                   in_stack_fffffffffffffcf0))),value);
    in_stack_fffffffffffffcf8 = local_10;
    local_2f3 = (bool)in_stack_fffffffffffffcf6;
  }
  local_11 = local_2f3;
  if ((local_1db & 1) != 0) {
    std::__cxx11::string::~string(local_1d8);
  }
  if ((local_1da & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
  }
  bVar1 = 1;
  if ((local_11 & 1U) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_200,"solved  status_crossover should not be IPX_STATUS_debug",&local_201);
    local_11 = ipxStatusError((bool)status_error,in_stack_fffffffffffffcf8,
                              (string *)
                              CONCAT17(in_stack_fffffffffffffcf7,
                                       CONCAT16(in_stack_fffffffffffffcf6,
                                                CONCAT15(bVar1,in_stack_fffffffffffffcf0))),
                              (int)((ulong)&local_201 >> 0x20));
    std::__cxx11::string::~string(local_200);
    std::allocator<char>::~allocator((allocator<char> *)&local_201);
    bVar1 = local_11;
  }
  local_11 = (bool)bVar1;
  return (bool)(local_11 & 1);
}

Assistant:

bool illegalIpxSolvedStatus(const ipx::Info& ipx_info,
                            const HighsOptions& options) {
  bool found_illegal_status = false;
  //========
  // For IPX
  //========
  // Can solve and be optimal
  // Can solve and be imprecise
  // Can solve and be primal_infeas
  // Can solve and be dual_infeas
  // Cannot solve and reach time limit
  found_illegal_status =
      found_illegal_status ||
      ipxStatusError(ipx_info.status_ipm == IPX_STATUS_time_limit, options,
                     "solved  status_ipm should not be IPX_STATUS_time_limit");
  // Cannot solve and reach iteration limit
  found_illegal_status =
      found_illegal_status ||
      ipxStatusError(ipx_info.status_ipm == IPX_STATUS_iter_limit, options,
                     "solved  status_ipm should not be IPX_STATUS_iter_limit");
  // Cannot solve and make no progress
  found_illegal_status =
      found_illegal_status ||
      ipxStatusError(ipx_info.status_ipm == IPX_STATUS_no_progress, options,
                     "solved  status_ipm should not be IPX_STATUS_no_progress");
  // Cannot solve and failed
  found_illegal_status =
      found_illegal_status ||
      ipxStatusError(ipx_info.status_ipm == IPX_STATUS_failed, options,
                     "solved  status_ipm should not be IPX_STATUS_failed");
  // Cannot solve and debug
  found_illegal_status =
      found_illegal_status ||
      ipxStatusError(ipx_info.status_ipm == IPX_STATUS_debug, options,
                     "solved  status_ipm should not be IPX_STATUS_debug");
  //==============
  // For crossover
  //==============
  // Can solve and be optimal
  // Can solve and be imprecise
  // Cannot solve with primal infeasibility
  found_illegal_status =
      found_illegal_status ||
      ipxStatusError(
          ipx_info.status_crossover == IPX_STATUS_primal_infeas, options,
          "solved  status_crossover should not be IPX_STATUS_primal_infeas");
  // Cannot solve with dual infeasibility
  found_illegal_status =
      found_illegal_status ||
      ipxStatusError(
          ipx_info.status_crossover == IPX_STATUS_dual_infeas, options,
          "solved  status_crossover should not be IPX_STATUS_dual_infeas");
  // Cannot solve and reach time limit
  found_illegal_status =
      found_illegal_status ||
      ipxStatusError(
          ipx_info.status_crossover == IPX_STATUS_time_limit, options,
          "solved  status_crossover should not be IPX_STATUS_time_limit");
  // Cannot solve and reach time limit
  found_illegal_status =
      found_illegal_status ||
      ipxStatusError(
          ipx_info.status_crossover == IPX_STATUS_iter_limit, options,
          "solved  status_crossover should not be IPX_STATUS_iter_limit");
  // Cannot solve and make no progress
  found_illegal_status =
      found_illegal_status ||
      ipxStatusError(
          ipx_info.status_crossover == IPX_STATUS_no_progress, options,
          "solved  status_crossover should not be IPX_STATUS_no_progress");
  // Cannot solve and failed
  found_illegal_status =
      found_illegal_status ||
      ipxStatusError(
          ipx_info.status_crossover == IPX_STATUS_failed, options,
          "solved  status_crossover should not be IPX_STATUS_failed");
  // Cannot solve and debug
  found_illegal_status =
      found_illegal_status ||
      ipxStatusError(ipx_info.status_crossover == IPX_STATUS_debug, options,
                     "solved  status_crossover should not be IPX_STATUS_debug");
  return found_illegal_status;
}